

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

List __thiscall xt::list::cons(list *this,List *list,Object *o)

{
  _List *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  List LVar2;
  shared_ptr<xt::_List> local_60 [2];
  Object local_40;
  Object *local_20;
  Object *o_local;
  List *list_local;
  
  local_20 = o;
  o_local = (Object *)list;
  list_local = (List *)this;
  this_00 = (_List *)operator_new(0x38);
  Object::Object(&local_40,o);
  std::shared_ptr<xt::_List>::shared_ptr(local_60,list);
  peVar1 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      list);
  _List::_List(this_00,&local_40,local_60,peVar1->count + 1);
  std::shared_ptr<xt::_List>::shared_ptr<xt::_List,void>((shared_ptr<xt::_List> *)this,this_00);
  std::shared_ptr<xt::_List>::~shared_ptr(local_60);
  Object::~Object(&local_40);
  LVar2.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar2.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (List)LVar2.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

List cons(List list, Object o) {
	return List(new _List {o, list, list->count+1});
}